

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::addSubDeviceInfo
          (CLIntercept *this,cl_device_id parentDevice,cl_device_id *devices,cl_uint numSubDevices)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  _Rb_tree_header *p_Var7;
  float __x;
  cl_device_id device;
  cl_device_id local_40;
  pthread_mutex_t *local_38;
  
  local_38 = (pthread_mutex_t *)&this->m_Mutex;
  iVar3 = pthread_mutex_lock(local_38);
  if (iVar3 == 0) {
    if (numSubDevices != 0) {
      p_Var1 = &(this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header;
      do {
        numSubDevices = numSubDevices - 1;
        local_40 = devices[numSubDevices];
        if (local_40 != (cl_device_id)0x0) {
          pmVar4 = std::
                   map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
                   ::operator[](&this->m_SubDeviceInfoMap,&local_40);
          pmVar4->ParentDevice = parentDevice;
          pmVar4->SubDeviceIndex = numSubDevices;
          p_Var2 = (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[*(cl_device_id *)(p_Var2 + 1) < local_40]) {
            if (*(cl_device_id *)(p_Var2 + 1) >= local_40) {
              p_Var5 = p_Var2;
            }
          }
          p_Var7 = p_Var1;
          if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
             (p_Var7 = (_Rb_tree_header *)p_Var5,
             local_40 < (cl_device_id)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
            p_Var7 = p_Var1;
          }
          if (p_Var7 != p_Var1) {
            logf(this,__x);
          }
        }
      } while (numSubDevices != 0);
    }
    pthread_mutex_unlock(local_38);
    return;
  }
  uVar6 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(local_38);
  _Unwind_Resume(uVar6);
}

Assistant:

void CLIntercept::addSubDeviceInfo(
    const cl_device_id parentDevice,
    const cl_device_id* devices,
    cl_uint numSubDevices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    while( numSubDevices-- )
    {
        cl_device_id    device = devices[ numSubDevices ];
        if( device )
        {
            SSubDeviceInfo& subDeviceInfo = m_SubDeviceInfoMap[ device ];

            subDeviceInfo.ParentDevice = parentDevice;
            subDeviceInfo.SubDeviceIndex = numSubDevices;

            // Currently, information about a device is assumed to be
            // invariant, though for sub-device handles the information
            // about a device can change if sub-device handles are recycled.
            // Since this is expected to occur rarely, for now simply log a
            // warning if this occurs.
            if( m_DeviceInfoMap.find(device) != m_DeviceInfoMap.end() )
            {
                logf( "Warning: found a recycled sub-device handle %p!\n",
                    device );
            }
        }
    }
}